

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::CheckerInstantiationSyntax::setChild
          (CheckerInstantiationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004c1b5c + *(int *)(&DAT_004c1b5c + index * 4)))();
  return;
}

Assistant:

void CheckerInstantiationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: type = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 2: parameters = child.node() ? &child.node()->as<ParameterValueAssignmentSyntax>() : nullptr; return;
        case 3: instances = child.node()->as<SeparatedSyntaxList<HierarchicalInstanceSyntax>>(); return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}